

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::detail::SocketStream::is_writable(SocketStream *this)

{
  ssize_t sVar1;
  
  sVar1 = select_write(this->sock_,this->write_timeout_sec_,this->write_timeout_usec_);
  return 0 < sVar1;
}

Assistant:

inline bool SocketStream::is_writable() const {
            return select_write(sock_, write_timeout_sec_, write_timeout_usec_) > 0;
        }